

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void __thiscall
gflags::anon_unknown_2::CommandLineFlagParser::ValidateFlags(CommandLineFlagParser *this,bool all)

{
  bool bVar1;
  byte bVar2;
  pointer ppVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [39];
  allocator local_71;
  string local_70 [48];
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
  local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
  local_28;
  FlagConstIterator i;
  FlagRegistryLock frl;
  bool all_local;
  CommandLineFlagParser *this_local;
  
  FlagRegistryLock::FlagRegistryLock((FlagRegistryLock *)&i,this->registry_);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_gflags::(anonymous_namespace)::CommandLineFlag_*,_gflags::(anonymous_namespace)::StringCmp,_std::allocator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>_>
       ::begin(&this->registry_->flags_);
  std::
  _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  do {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<const_char_*,_gflags::(anonymous_namespace)::CommandLineFlag_*,_gflags::(anonymous_namespace)::StringCmp,_std::allocator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>_>
         ::end(&this->registry_->flags_);
    std::
    _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
    ::_Rb_tree_const_iterator(&local_38,&local_40);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) {
      FlagRegistryLock::~FlagRegistryLock((FlagRegistryLock *)&i);
      return;
    }
    if (all) {
LAB_0011ee34:
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
               ::operator->(&local_28);
      bVar1 = CommandLineFlag::ValidateCurrent(ppVar3->second);
      if (!bVar1) {
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
                 ::operator->(&local_28);
        pcVar4 = CommandLineFlag::name(ppVar3->second);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,pcVar4,&local_71);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&this->error_flags_,(key_type *)local_70);
        bVar2 = std::__cxx11::string::empty();
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        if ((bVar2 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_f8,"ERROR: ",&local_f9);
          std::operator+(local_d8,(char *)local_f8);
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
                   ::operator->(&local_28);
          CommandLineFlag::name(ppVar3->second);
          std::operator+(local_b8,(char *)local_d8);
          std::operator+(local_98,(char *)local_b8);
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
                   ::operator->(&local_28);
          pcVar4 = CommandLineFlag::name(ppVar3->second);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_120,pcVar4,&local_121);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->error_flags_,(key_type *)local_120);
          std::__cxx11::string::operator=((string *)pmVar5,(string *)local_98);
          std::__cxx11::string::~string(local_120);
          std::allocator<char>::~allocator((allocator<char> *)&local_121);
          std::__cxx11::string::~string((string *)local_98);
          std::__cxx11::string::~string((string *)local_b8);
          std::__cxx11::string::~string((string *)local_d8);
          std::__cxx11::string::~string(local_f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_f9);
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
                   ::operator->(&local_28);
          bVar1 = CommandLineFlag::Modified(ppVar3->second);
          if (!bVar1) {
            ppVar3 = std::
                     _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
                     ::operator->(&local_28);
            pcVar4 = CommandLineFlag::name(ppVar3->second);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_148,pcVar4,&local_149);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&this->error_flags_,(key_type *)local_148);
            std::__cxx11::string::operator+=((string *)pmVar5," (default value fails validation)");
            std::__cxx11::string::~string(local_148);
            std::allocator<char>::~allocator((allocator<char> *)&local_149);
          }
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
                   ::operator->(&local_28);
          pcVar4 = CommandLineFlag::name(ppVar3->second);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_170,pcVar4,&local_171);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->error_flags_,(key_type *)local_170);
          std::__cxx11::string::operator+=((string *)pmVar5,"\n");
          std::__cxx11::string::~string(local_170);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
        }
      }
    }
    else {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
               ::operator->(&local_28);
      bVar1 = CommandLineFlag::Modified(ppVar3->second);
      if (!bVar1) goto LAB_0011ee34;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

void CommandLineFlagParser::ValidateFlags(bool all) {
  FlagRegistryLock frl(registry_);
  for (FlagRegistry::FlagConstIterator i = registry_->flags_.begin();
       i != registry_->flags_.end(); ++i) {
    if ((all || !i->second->Modified()) && !i->second->ValidateCurrent()) {
      // only set a message if one isn't already there.  (If there's
      // an error message, our job is done, even if it's not exactly
      // the same error.)
      if (error_flags_[i->second->name()].empty()) {
        error_flags_[i->second->name()] =
            string(kError) + "--" + i->second->name() +
            " must be set on the commandline";
        if (!i->second->Modified()) {
          error_flags_[i->second->name()] += " (default value fails validation)";
        }
        error_flags_[i->second->name()] += "\n";
      }
    }
  }
}